

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O2

void test_font_props(wins *wins_ar,int ar_len)

{
  Am_Font_Family_Flag AVar1;
  Am_Drawonable *font_win;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int max_char_descent;
  int max_char_ascent;
  ulong local_58;
  long local_50;
  long local_48;
  Am_Font local_40 [8];
  int min_char_width;
  int max_char_width;
  
  test_string = "Egypt";
  test_str_len = 5;
  uVar4 = 0;
  uVar5 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar5 = uVar4;
  }
  do {
    if ((int)uVar4 == 2) {
      return;
    }
    local_58 = uVar4;
    for (uVar3 = 0; uVar3 != 2; uVar3 = uVar3 + 1) {
      for (local_50 = 0; local_50 != 3; local_50 = local_50 + 1) {
        AVar1 = test_font_variety::family_array[local_50];
        for (local_48 = 0; local_48 != 4; local_48 = local_48 + 1) {
          Am_Font::Am_Font(local_40,AVar1,(int)uVar4 != 0,uVar3 != 0,false,
                           test_font_variety::size_array[local_48]);
          Am_Font::operator=((Am_Font *)&test_font,local_40);
          Am_Font::~Am_Font(local_40);
          lVar2 = 0;
          while (uVar5 * 0x40 + 0x40 != lVar2 + 0x40) {
            font_win = *(Am_Drawonable **)((long)&wins_ar->font_win + lVar2);
            (**(code **)(*(long *)font_win + 0xd8))
                      (font_win,&test_font,&max_char_width,&min_char_width,&max_char_ascent,
                       &max_char_descent);
            update_font_numbers(font_win,false);
            if ((max_char_ascent < test_string_ascent) ||
               (lVar2 = lVar2 + 0x40, max_char_descent < test_string_descent)) {
              printf("test_font_props() failed:  bold=%d, ital=%d, fam=%d, size=%d\n",local_58,
                     (ulong)uVar3,local_50,local_48);
              exit(-1);
            }
          }
          uVar4 = local_58;
        }
      }
    }
    uVar4 = (ulong)((int)uVar4 + 1);
  } while( true );
}

Assistant:

void
test_font_props(wins *wins_ar, int ar_len)
{
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[4] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_LARGE, Am_FONT_VERY_LARGE};
  test_string = "Egypt";
  test_str_len = 5;
  for (int bold = 0; bold < 2; bold++) {
    for (int ital = 0; ital < 2; ital++) {
      for (int fam = 0; fam < 3; fam++) {
        for (int size = 0; size < 4; size++) {
          int max_char_width, min_char_width, max_char_ascent, max_char_descent;
          test_font =
              Am_Font(family_array[fam], bold, ital, false, size_array[size]);
          for (int i = 0; i < ar_len; i++) {
            Am_Drawonable *font_win = wins_ar[i].font_win;
            font_win->Get_Font_Properties(test_font, max_char_width,
                                          min_char_width, max_char_ascent,
                                          max_char_descent);
            update_font_numbers(font_win);
            if ((test_string_ascent > max_char_ascent) ||
                (test_string_descent > max_char_descent)) {
              //(test_string_width   < (test_str_len * min_char_width)) || //under Windows, we get aver. char. width
              //as min. char. width
              //(test_string_width   > (test_str_len * max_char_width)))
              printf("test_font_props() failed:  bold=%d, ital=%d, fam=%d, "
                     "size=%d\n",
                     bold, ital, fam, size);
              exit(-1);
            }
          }
        }
      }
    }
  }
  //  fprintf(stderr, "test_font_props() passed all standard font tests.\n");
}